

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExponentiallyDecayingReservoir.cc
# Opt level: O1

ExponentiallyDecayingReservoir * __thiscall
cppmetrics::ExponentiallyDecayingReservoir::operator=
          (ExponentiallyDecayingReservoir *this,ExponentiallyDecayingReservoir *other)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&other->m_mutex);
  if (iVar1 == 0) {
    LOCK();
    (this->m_count).super___atomic_base<long>._M_i = (other->m_count).super___atomic_base<long>._M_i
    ;
    UNLOCK();
    this->m_clock = other->m_clock;
    this->m_start = other->m_start;
    this->m_next_rescale_time = other->m_next_rescale_time;
    this->m_size = other->m_size;
    this->m_alpha = other->m_alpha;
    std::
    map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
    ::operator=(&this->m_samples,&other->m_samples);
    LOCK();
    (other->m_count).super___atomic_base<long>._M_i = 0;
    UNLOCK();
    other->m_next_rescale_time = 0;
    other->m_size = 0;
    other->m_clock = (Clock *)0x0;
    other->m_start = 0;
    other->m_alpha = 0.0;
    pthread_mutex_unlock((pthread_mutex_t *)&other->m_mutex);
    return this;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

ExponentiallyDecayingReservoir& ExponentiallyDecayingReservoir::operator=(ExponentiallyDecayingReservoir&& other)
{
  std::lock_guard<std::mutex> lock(other.m_mutex);

  m_count.store(other.m_count.load());
  m_clock = other.m_clock;
  m_start = other.m_start;
  m_next_rescale_time = other.m_next_rescale_time;
  m_size = other.m_size;
  m_alpha = other.m_alpha;
  m_samples = std::move(other.m_samples);

  other.m_count.store(0);
  other.m_clock = nullptr;
  other.m_start = 0;
  other.m_next_rescale_time = 0;
  other.m_size = 0;
  other.m_alpha = 0.0;
  // other.m_samples is already moved

  return *this;
}